

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fzn-chuffed.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  exception *e;
  Error *e_1;
  uint ii;
  vec<BoolView> ng;
  string filename;
  int i;
  string commandLine;
  string *in_stack_00000248;
  string *in_stack_00000250;
  char ***in_stack_00000258;
  int *in_stack_00000260;
  undefined1 in_stack_00000367;
  BoolView *in_stack_00000368;
  ostream *in_stack_00000468;
  string *in_stack_00000470;
  string *in_stack_00001280;
  Problem *in_stack_00001288;
  Engine *in_stack_00001290;
  vec<BoolView> *in_stack_fffffffffffffe70;
  vec<BoolView> *in_stack_fffffffffffffe98;
  Engine *in_stack_fffffffffffffea0;
  string local_108 [8];
  vec<BoolView> *in_stack_ffffffffffffff00;
  uint local_e4;
  string local_e0 [32];
  vec<BoolView> local_c0;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [52];
  int local_34;
  string local_30 [32];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_30);
  for (local_34 = 0; local_34 < local_8; local_34 = local_34 + 1) {
    if (0 < local_34) {
      std::__cxx11::string::operator+=(local_30," ");
    }
    std::__cxx11::string::operator+=(local_30,(char *)local_10[local_34]);
  }
  std::__cxx11::string::string(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"fzn",&local_89);
  parseOptions(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if (local_8 == 1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      FlatZinc::solve(in_stack_00000470,in_stack_00000468);
    }
    else {
      FlatZinc::solve((istream *)in_stack_00000250,(ostream *)in_stack_00000248);
    }
    signal(2,SIGINT_handler);
    Engine::set_assumptions(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if ((engine.opt_var == (IntVar *)0x0) || (so.nof_solutions == 0)) {
      Engine::solve(in_stack_00001290,in_stack_00001288,in_stack_00001280);
    }
    else {
      Engine::setOutputStream(&engine,(ostream *)(output_buffer_abi_cxx11_ + 0x10));
      Engine::solve(in_stack_00001290,in_stack_00001288,in_stack_00001280);
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)&std::cout,local_b0);
      std::__cxx11::string::~string(local_b0);
    }
    if (engine.status == RES_LUN) {
      vec<BoolView>::vec(&local_c0);
      Engine::retrieve_assumption_nogood(in_stack_ffffffffffffff00);
      std::operator<<((ostream *)&std::cout,"% [");
      uVar1 = vec<BoolView>::size(&local_c0);
      if (uVar1 != 0) {
        vec<BoolView>::operator[](&local_c0,0);
        get_bv_string_abi_cxx11_(in_stack_00000368,(bool)in_stack_00000367);
        std::operator<<((ostream *)&std::cout,local_e0);
        std::__cxx11::string::~string(local_e0);
        for (local_e4 = 1; uVar1 = vec<BoolView>::size(&local_c0), local_e4 < uVar1;
            local_e4 = local_e4 + 1) {
          poVar2 = std::operator<<((ostream *)&std::cout,", ");
          vec<BoolView>::operator[](&local_c0,local_e4);
          get_bv_string_abi_cxx11_(in_stack_00000368,(bool)in_stack_00000367);
          std::operator<<(poVar2,local_108);
          std::__cxx11::string::~string(local_108);
        }
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"]");
      std::operator<<(poVar2,'\n');
      vec<BoolView>::~vec(in_stack_fffffffffffffe70);
    }
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,(char *)*local_10);
  poVar2 = std::operator<<(poVar2,": unrecognized option ");
  poVar2 = std::operator<<(poVar2,(char *)local_10[1]);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,(char *)*local_10);
  std::operator<<(poVar2,": use --help for more information.\n");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	try {
		// Make a copy of the arguments for posterity.
		std::string commandLine;
		for (int i = 0; i < argc; i++) {
			if (i > 0) {
				commandLine += " ";
			}
			commandLine += argv[i];
		}

		// if (argc == 2 && strcmp(argv[1], "--version") == 0) {
		//   std::cout << versionString << "\n";
		//   return 0;
		// }

		std::string filename;
		parseOptions(argc, argv, &filename, "fzn");

		if (argc != 1) {
			std::cerr << argv[0] << ": unrecognized option " << argv[1] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}

		if (filename.empty()) {
			FlatZinc::solve(std::cin, std::cerr);
		} else {
			FlatZinc::solve(filename);
		}

		// Install signal handler
#ifdef WIN32
		SetConsoleCtrlHandler((PHANDLER_ROUTINE)SIGINT_handler, true);
#else
		// TODO: Make signal handler use C linkage
		std::signal(SIGINT, SIGINT_handler);  // NOLINT(bugprone-signal-handler)
#endif

		engine.set_assumptions(FlatZinc::s->assumptions);
		if (engine.opt_var != nullptr && so.nof_solutions != 0) {
			engine.setOutputStream(output_buffer);
			engine.solve(FlatZinc::s, commandLine);
			std::cout << output_buffer.str();
		} else {
			engine.solve(FlatZinc::s, commandLine);
		}

		if (engine.status == RES_LUN) {
			vec<BoolView> ng;
			Engine::retrieve_assumption_nogood(ng);
			std::cout << "% [";
			if (ng.size() > 0) {
				std::cout << get_bv_string(ng[0], so.assump_int);
				for (unsigned int ii = 1; ii < ng.size(); ii++) {
					std::cout << ", " << get_bv_string(ng[ii], so.assump_int);
				}
			}
			std::cout << "]" << '\n';
		}
	} catch (const std::exception& e) {
		std::cerr << e.what() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (const FlatZinc::Error& e) {
		std::cerr << e.toString() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (...) {
		std::cerr << "  UNKNOWN EXCEPTION." << '\n';
		std::exit(EXIT_FAILURE);
	}
	return 0;
}